

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

bool __thiscall
QPDFObjectHandle::isDictionaryOfType(QPDFObjectHandle *this,string *type,string *subtype)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  bVar1 = isDictionary(this);
  if (bVar1) {
    bVar1 = type->_M_string_length != 0;
    if (bVar1) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"/Type","");
      getKey(&local_70,(string *)this);
      bVar2 = isNameAndEquals(&local_70,type);
      if (!bVar2) {
        bVar1 = true;
        goto LAB_001c3ae1;
      }
    }
    if (subtype->_M_string_length == 0) {
      bVar3 = true;
      bVar2 = false;
    }
    else {
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"/Subtype","");
      getKey(&local_80,(string *)this);
      bVar3 = isNameAndEquals(&local_80,subtype);
      bVar2 = true;
    }
  }
  else {
    bVar1 = false;
LAB_001c3ae1:
    bVar2 = false;
    bVar3 = false;
  }
  if (bVar2) {
    if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  }
  if (bVar1) {
    if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return bVar3;
}

Assistant:

bool
QPDFObjectHandle::isDictionaryOfType(std::string const& type, std::string const& subtype) const
{
    return isDictionary() && (type.empty() || getKey("/Type").isNameAndEquals(type)) &&
        (subtype.empty() || getKey("/Subtype").isNameAndEquals(subtype));
}